

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration_manager.cpp
# Opt level: O0

vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
* __thiscall
miniros::master::RegistrationManager::getTopicSubscribers(RegistrationManager *this,string *topic)

{
  bool bVar1;
  value_type *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  shared_ptr<miniros::master::NodeRef> node;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *api;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sub_api;
  scoped_lock<std::mutex> lock;
  vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
  *result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  undefined1 *local_58;
  string *in_stack_ffffffffffffffc0;
  RegistrationManager *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar2;
  byte bVar3;
  
  __lhs = in_RDI;
  ::std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_RDI,(mutex_type *)in_RDI);
  uVar2 = 0;
  ::std::
  vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
  ::vector((vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
            *)0x545a88);
  Registrations::getApis
            ((Registrations *)CONCAT17(uVar2,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
  local_58 = &stack0xffffffffffffffc0;
  local_60._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_RDI);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)__lhs,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)in_RDI), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_60);
    getNodeByAPIUnsafe(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffff80);
    if (bVar1) {
      ::std::
      vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
      ::push_back((vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
                   *)in_stack_ffffffffffffff80,in_RSI);
    }
    ::std::shared_ptr<miniros::master::NodeRef>::~shared_ptr
              ((shared_ptr<miniros::master::NodeRef> *)0x545b74);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_60);
  }
  bVar3 = 1;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffff80);
  if ((bVar3 & 1) == 0) {
    ::std::
    vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
    ::~vector((vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
               *)in_stack_ffffffffffffff80);
  }
  ::std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x545bbb);
  return (vector<std::shared_ptr<miniros::master::NodeRef>,_std::allocator<std::shared_ptr<miniros::master::NodeRef>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::shared_ptr<NodeRef>> RegistrationManager::getTopicSubscribers(const std::string& topic) const
{
  std::scoped_lock<std::mutex> lock(m_guard);

  std::vector<std::shared_ptr<NodeRef>> result;
  std::vector<std::string> sub_api = subscribers.getApis(topic);
  for (const auto& api: sub_api) {
    auto node = getNodeByAPIUnsafe(api);
    if (node) {
      result.push_back(node);
    }
  }
  return result;
}